

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<test_result_(wchar_t)>::FunctionMockerBase
          (FunctionMockerBase<test_result_(wchar_t)> *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001ba0c8;
  (this->current_spec_).function_mocker_ = this;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<wchar_t>.impl_.value_ =
       (MatcherInterface<wchar_t> *)0x0;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<wchar_t>.impl_.link_.next_ =
       &(this->current_spec_).matchers_.f0_.super_MatcherBase<wchar_t>.impl_.link_;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<wchar_t>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001ba118;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}